

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O0

void __thiscall
HighsSparseMatrix::range(HighsSparseMatrix *this,double *min_value,double *max_value)

{
  int iVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  double *pdVar4;
  double *in_RDX;
  double *in_RSI;
  long in_RDI;
  double value;
  HighsInt iEl;
  value_type local_28;
  int local_1c;
  double *local_18;
  double *local_10;
  
  local_1c = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  while( true ) {
    iVar1 = local_1c;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10),
                        (long)*(int *)(in_RDI + 4));
    if (*pvVar2 <= iVar1) break;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),(long)local_1c);
    local_28 = ABS(*pvVar3);
    pdVar4 = std::min<double>(local_10,&local_28);
    *local_10 = *pdVar4;
    pdVar4 = std::max<double>(local_18,&local_28);
    *local_18 = *pdVar4;
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void HighsSparseMatrix::range(double& min_value, double& max_value) const {
  assert(this->formatOk());
  for (HighsInt iEl = 0; iEl < this->start_[this->num_col_]; iEl++) {
    double value = fabs(this->value_[iEl]);
    min_value = min(min_value, value);
    max_value = max(max_value, value);
  }
}